

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O3

void cmScriptGeneratorEncodeConfig(string *config,string *result)

{
  char cVar1;
  char cVar2;
  char *c;
  
  cVar1 = *(char *)&(config->_M_dataplus)._M_p;
  do {
    if (cVar1 == '\0') {
      return;
    }
    cVar2 = (char)result;
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      std::__cxx11::string::append((char *)result);
      std::__cxx11::string::push_back(cVar2);
LAB_002fe595:
      std::__cxx11::string::push_back(cVar2);
      std::__cxx11::string::append((char *)result);
    }
    else {
      if ((byte)(cVar1 + 0xbfU) < 0x1a) {
        std::__cxx11::string::append((char *)result);
        std::__cxx11::string::push_back(cVar2);
        goto LAB_002fe595;
      }
      std::__cxx11::string::push_back(cVar2);
    }
    cVar1 = *(char *)((long)&(config->_M_dataplus)._M_p + 1);
    config = (string *)((long)&(config->_M_dataplus)._M_p + 1);
  } while( true );
}

Assistant:

static void cmScriptGeneratorEncodeConfig(const std::string& config,
                                          std::string& result)
{
  for (const char* c = config.c_str(); *c; ++c) {
    if (*c >= 'a' && *c <= 'z') {
      result += "[";
      result += static_cast<char>(*c + 'A' - 'a');
      result += *c;
      result += "]";
    } else if (*c >= 'A' && *c <= 'Z') {
      result += "[";
      result += *c;
      result += static_cast<char>(*c + 'a' - 'A');
      result += "]";
    } else {
      result += *c;
    }
  }
}